

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O1

void __thiscall BtorSimVCDWriter::write_node_header(BtorSimVCDWriter *this,ModuleTreeNode *top)

{
  ofstream *poVar1;
  pointer ppMVar2;
  map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  size_t sVar8;
  mapped_type *pmVar9;
  _Rb_tree_node_base *p_Var10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  char *__s;
  pointer ppMVar13;
  int64_t id;
  string symbol;
  pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  i;
  string am_ident;
  string idx;
  string type;
  char *local_148;
  char *local_140;
  long local_138;
  char local_130 [16];
  char *local_120;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  undefined4 local_f8;
  char *local_f0;
  long local_e8;
  char local_e0 [16];
  char *local_d0;
  long local_c8;
  char local_c0 [16];
  pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  ModuleTreeNode *local_68;
  map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
  *local_60;
  map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  BtorSimVCDWriter *local_40;
  _Rb_tree_node_base *local_38;
  
  poVar1 = &this->vcd_file;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"$scope module ",0xe);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(top->name)._M_dataplus._M_p,(top->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," $end\n",6);
  p_Var11 = (top->wire_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(top->wire_names)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_68 = top;
  if (p_Var11 != local_38) {
    local_58 = &this->bv_identifiers;
    p_Var12 = &(this->bv_identifiers)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_60 = &this->clocks;
    local_50 = &(this->clocks)._M_t._M_impl.super__Rb_tree_header._M_header;
    pmVar3 = &this->am_identifiers;
    local_48 = p_Var12;
    local_40 = this;
    do {
      local_120 = *(char **)(p_Var11 + 1);
      local_118 = local_108;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,p_Var11[1]._M_parent,
                 (long)&(p_Var11[1]._M_parent)->_M_color + (long)&(p_Var11[1]._M_left)->_M_color);
      local_f8 = *(undefined4 *)&p_Var11[2]._M_parent;
      local_148 = local_120;
      local_140 = local_130;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_140,local_118,local_118 + local_110);
      p_Var5 = p_Var12;
      for (p_Var6 = (this->bv_identifiers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var6 != (_Base_ptr)0x0;
          p_Var6 = (&p_Var6->_M_left)[*(long *)(p_Var6 + 1) < (long)local_148]) {
        if ((long)local_148 <= *(long *)(p_Var6 + 1)) {
          p_Var5 = p_Var6;
        }
      }
      p_Var6 = p_Var12;
      if ((p_Var5 != p_Var12) && (p_Var6 = p_Var5, (long)local_148 < *(long *)(p_Var5 + 1))) {
        p_Var6 = p_Var12;
      }
      if (p_Var6 == p_Var12) {
        for (p_Var10 = (this->am_identifiers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var10 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
          std::
          pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair(&local_b0,
                 (pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(p_Var10 + 1));
          if ((char *)local_b0.first.first == local_148) {
            local_d0 = local_c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,local_b0.first.second._M_dataplus._M_p,
                       local_b0.first.second._M_dataplus._M_p +
                       local_b0.first.second._M_string_length);
            local_f0 = local_e0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,local_b0.second._M_dataplus._M_p,
                       local_b0.second._M_dataplus._M_p + local_b0.second._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"$var wire ",10);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_f0,local_e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_140,local_138);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<",1);
            *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                 *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_d0,local_c8);
            *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                 *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"> $end\n",7);
            if (local_f0 != local_e0) {
              operator_delete(local_f0);
            }
            if (local_d0 != local_c0) {
              operator_delete(local_d0);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0.second._M_dataplus._M_p != &local_b0.second.field_2) {
            operator_delete(local_b0.second._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0.first.second._M_dataplus._M_p != &local_b0.first.second.field_2) {
            operator_delete(local_b0.first.second._M_dataplus._M_p);
          }
        }
      }
      else {
        p_Var6 = local_50;
        for (p_Var12 = (this->clocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var12 != (_Base_ptr)0x0;
            p_Var12 = (&p_Var12->_M_left)[*(long *)(p_Var12 + 1) < (long)local_148]) {
          if ((long)local_148 <= *(long *)(p_Var12 + 1)) {
            p_Var6 = p_Var12;
          }
        }
        p_Var12 = local_50;
        if ((p_Var6 != local_50) && (p_Var12 = p_Var6, (long)local_148 < *(long *)(p_Var6 + 1))) {
          p_Var12 = local_50;
        }
        __s = "wire";
        if (p_Var12 != local_50) {
          pmVar7 = std::
                   map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
                   ::operator[](local_60,(key_type *)&local_148);
          __s = "wire";
          if (*pmVar7 == EVENT) {
            __s = "event";
          }
        }
        local_b0.first.first = (long)&local_b0.first.second._M_string_length;
        sVar8 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,__s,__s + sVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"$var ",5);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar1,(char *)local_b0.first.first,
                            (long)local_b0.first.second._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        pmVar9 = std::
                 map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_58,(key_type *)&local_120);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(pmVar9->_M_dataplus)._M_p,pmVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_140,local_138);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," $end\n",6);
        if ((size_type *)local_b0.first.first != &local_b0.first.second._M_string_length) {
          operator_delete((void *)local_b0.first.first);
        }
      }
      if (local_140 != local_130) {
        operator_delete(local_140);
      }
      this = local_40;
      p_Var12 = local_48;
      if (local_118 != local_108) {
        operator_delete(local_118);
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while (p_Var11 != local_38);
  }
  ppMVar2 = (local_68->submodules).
            super__Vector_base<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar13 = (local_68->submodules).
                  super__Vector_base<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppMVar13 != ppMVar2; ppMVar13 = ppMVar13 + 1) {
    write_node_header(this,*ppMVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"$upscope $end\n",0xe);
  return;
}

Assistant:

void
BtorSimVCDWriter::write_node_header (ModuleTreeNode* top)
{
  vcd_file << "$scope module " << top->name << " $end\n";
  for (auto i : top->wire_names)
  {
    int64_t id         = i.first;
    std::string symbol = i.second.first;
    uint32_t width     = i.second.second;
    if (bv_identifiers.find (id) != bv_identifiers.end ())
    {
      std::string type =
          (clocks.find (id) != clocks.end () && clocks[id] == EVENT) ? "event"
                                                                     : "wire";
      vcd_file << "$var " << type << " " << width << " "
               << bv_identifiers[i.first] << " " << symbol << " $end\n";
    }
    else
      for (auto j : am_identifiers)
      {
        if (j.first.first == id)
        {
          std::string idx      = j.first.second;
          std::string am_ident = j.second;
          vcd_file << "$var wire " << width << " " << am_ident << " " << symbol
                   << "<" << std::hex << idx << std::dec << "> $end\n";
        }
      }
  }
  for (ModuleTreeNode* s : top->submodules)
  {
    write_node_header (s);
  }
  vcd_file << "$upscope $end\n";
}